

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O0

test_result * __thiscall
ut::test_case_impl<agge::tests::LayoutTests>::execute
          (test_result *__return_storage_ptr__,test_case_impl<agge::tests::LayoutTests> *this)

{
  setup_impl<agge::tests::LayoutTests> *psVar1;
  code *local_140;
  exception *e;
  exception *e_2;
  exception *e_1;
  undefined1 local_51 [8];
  LayoutTests f;
  string outcome;
  bool terminated;
  bool passed;
  bool initialized;
  test_case_impl<agge::tests::LayoutTests> *this_local;
  
  std::__cxx11::string::string((string *)&f.field_0x9);
  agge::tests::LayoutTests::LayoutTests((LayoutTests *)local_51);
  psVar1 = shared_ptr<ut::setup_impl<agge::tests::LayoutTests>,_unsigned_int>::operator->
                     (&this->_setup);
  setup_impl<agge::tests::LayoutTests>::init(psVar1,(EVP_PKEY_CTX *)local_51);
  local_140 = (code *)this->_method;
  if (((ulong)local_140 & 1) != 0) {
    local_140 = *(code **)(local_140 + *(long *)(local_51 + *(long *)&this->field_0x10) + -1);
  }
  (*local_140)(local_51 + *(long *)&this->field_0x10);
  psVar1 = shared_ptr<ut::setup_impl<agge::tests::LayoutTests>,_unsigned_int>::operator->
                     (&this->_setup);
  setup_impl<agge::tests::LayoutTests>::teardown(psVar1,(LayoutTests *)local_51);
  test_result::test_result(__return_storage_ptr__,true,true,true,(string *)&f.field_0x9);
  std::__cxx11::string::~string((string *)&f.field_0x9);
  return __return_storage_ptr__;
}

Assistant:

inline test_result test_case_impl<Fixture>::execute()
	{
		bool initialized = false;
		bool passed = false;
		bool terminated = false;
		std::string outcome;

		try
		{
			Fixture f;

			try
			{
				_setup->init(f);
				initialized = true;

				try
				{
					(f.*_method)();
					passed = true;
				}
				catch (const std::exception &e)
				{
					outcome = e.what();
				}
				catch (...)
				{
					outcome = "Test Failed!";
				}

				try
				{
					_setup->teardown(f);
					terminated = true;
				}
				catch (const std::exception &e)
				{
					outcome += outcome.empty() ? "" : "\n";
					outcome += std::string("Teardown Failed: ") + e.what();
				}
				catch (...)
				{
					outcome += outcome.empty() ? "" : "\n";
					outcome += "Teardown Failed!";
				}
			}
			catch (const std::exception &e)
			{
				outcome = std::string("Initialization Failed: ") + e.what();
			}
			catch (...)
			{
				outcome = "Initialization Failed!";
			}
		}
		catch (...)
		{
		}
		return test_result(initialized, passed, terminated, outcome);
	}